

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O3

uint8_t * skip_aux(uint8_t *s)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  byte *pbVar6;
  
  bVar2 = *s;
  uVar4 = 1;
  if (bVar2 < 0x5a) {
    switch(bVar2) {
    case 0x41:
    case 0x43:
      goto switchD_00141062_caseD_41;
    case 0x42:
    case 0x48:
      goto switchD_00141062_caseD_42;
    case 0x44:
    case 0x45:
    case 0x46:
    case 0x47:
switchD_00141062_caseD_44:
      abort();
    case 0x49:
switchD_00141062_caseD_49:
      uVar4 = 4;
      goto switchD_00141062_caseD_41;
    default:
      if (bVar2 != 0x53) goto switchD_00141062_caseD_44;
LAB_0014108d:
      uVar4 = 2;
      goto switchD_00141062_caseD_41;
    }
  }
  switch(bVar2) {
  case 100:
    uVar4 = 8;
  case 99:
switchD_00141062_caseD_41:
    return s + uVar4 + 1;
  case 0x65:
  case 0x67:
  case 0x68:
    goto switchD_00141062_caseD_44;
  case 0x66:
  case 0x69:
    goto switchD_00141062_caseD_49;
  }
  if (bVar2 != 0x5a) {
    if (bVar2 != 0x73) goto switchD_00141062_caseD_44;
    goto LAB_0014108d;
  }
switchD_00141062_caseD_42:
  pbVar6 = s + 1;
  if ((ulong)bVar2 != 0x42) {
    if ((bVar2 == 0x5a) || (uVar4 = (ulong)bVar2, bVar2 == 0x48)) {
      do {
        pbVar1 = pbVar6 + 1;
        bVar2 = *pbVar6;
        pbVar6 = pbVar1;
      } while (bVar2 != 0);
      return pbVar1;
    }
    goto switchD_00141062_caseD_41;
  }
  bVar2 = *pbVar6;
  uVar5 = (uint)bVar2;
  uVar3 = 1;
  if (0x59 < bVar2) {
    switch(bVar2) {
    case 99:
      break;
    case 100:
      uVar3 = 8;
      break;
    case 0x66:
    case 0x69:
switchD_001410f3_caseD_49:
      uVar3 = 4;
      break;
    default:
      if (bVar2 == 0x5a) goto switchD_001410f3_caseD_42;
      if (uVar5 == 0x73) goto LAB_0014111e;
    case 0x65:
    case 0x67:
    case 0x68:
switchD_001410f3_caseD_44:
      uVar3 = 0;
    }
switchD_001410f3_caseD_41:
    return s + (ulong)(uVar3 * *(int *)(s + 2)) + 6;
  }
  switch(bVar2) {
  case 0x41:
  case 0x43:
    goto switchD_001410f3_caseD_41;
  case 0x42:
  case 0x48:
switchD_001410f3_caseD_42:
    uVar3 = uVar5;
    goto switchD_001410f3_caseD_41;
  case 0x44:
  case 0x45:
  case 0x46:
  case 0x47:
    break;
  case 0x49:
    goto switchD_001410f3_caseD_49;
  default:
    if (uVar5 == 0x53) {
LAB_0014111e:
      uVar3 = 2;
      goto switchD_001410f3_caseD_41;
    }
  }
  goto switchD_001410f3_caseD_44;
}

Assistant:

static inline uint8_t *skip_aux(uint8_t *s)
{
    int size = aux_type2size(*s); ++s; // skip type
    uint32_t n;
    switch (size) {
    case 'Z':
    case 'H':
        while (*s) ++s;
        return s + 1;
    case 'B':
        size = aux_type2size(*s); ++s;
        memcpy(&n, s, 4); s += 4;
        return s + size * n;
    case 0:
        abort();
        break;
    default:
        return s + size;
    }
}